

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O1

int replaceTxa(istream *in,ostream *output,path *replacement)

{
  undefined8 *puVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  pointer pcVar9;
  thread *ptVar10;
  _Alloc_hider _Var11;
  size_t sVar12;
  TxaChunk *chunk;
  size_type *psVar13;
  pointer __n;
  anon_class_32_4_76e35334_for__M_head_impl *extraout_RDX;
  anon_class_32_4_76e35334_for__M_head_impl *extraout_RDX_00;
  anon_class_32_4_76e35334_for__M_head_impl *__args;
  anon_class_32_4_76e35334_for__M_head_impl *extraout_RDX_01;
  thread *thread;
  long lVar14;
  pointer pcVar15;
  long lVar16;
  ulong uVar17;
  thread *ptVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  bool indexed;
  size_type local_198;
  char local_189;
  string replacementName;
  path rfilename;
  TxaHeader header;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  chunks;
  Compressor compressor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string replacementTemplate;
  path local_a0;
  vector<Image,_std::allocator<Image>_> images;
  atomic<unsigned_long> i;
  path replacementDir;
  
  std::filesystem::__cxx11::path::parent_path();
  auVar21 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar21._8_8_ == 0 || auVar21._0_8_ == 0) {
    std::filesystem::__cxx11::path::path((path *)&header);
  }
  else {
    std::__cxx11::string::substr((ulong)&rfilename,auVar21._0_8_);
    std::filesystem::__cxx11::path::path((path *)&header,&rfilename._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rfilename._M_pathname._M_dataplus._M_p != &rfilename._M_pathname.field_2) {
      operator_delete(rfilename._M_pathname._M_dataplus._M_p,
                      rfilename._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  replacementTemplate._M_dataplus._M_p = (pointer)&replacementTemplate.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&replacementTemplate,CONCAT44(header.filesize,header._0_4_),
             CONCAT44(header.largestDecodedChunk,header.indexed) +
             CONCAT44(header.filesize,header._0_4_));
  std::filesystem::__cxx11::path::~path((path *)&header);
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  rfilename._M_pathname.field_2._M_allocated_capacity = 0;
  rfilename._M_pathname.field_2._8_8_ = 0;
  rfilename._M_pathname._M_dataplus._M_p = (pointer)0x0;
  rfilename._M_pathname._M_string_length = 0;
  std::vector<Image,_std::allocator<Image>_>::vector
            (&images,((long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (value_type *)&rfilename,(allocator_type *)&local_a0);
  if (rfilename._M_pathname._M_string_length != 0) {
    operator_delete((void *)rfilename._M_pathname._M_string_length,
                    rfilename._M_pathname.field_2._8_8_ - rfilename._M_pathname._M_string_length);
  }
  rfilename._M_pathname._M_dataplus._M_p = (pointer)0x0;
  rfilename._M_pathname._M_string_length = 0;
  rfilename._M_pathname.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&chunks,((long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
           (value_type *)&rfilename,(allocator_type *)&local_a0);
  if (rfilename._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(rfilename._M_pathname._M_dataplus._M_p,
                    rfilename._M_pathname.field_2._M_allocated_capacity -
                    (long)rfilename._M_pathname._M_dataplus._M_p);
  }
  Compressor::Compressor(&compressor);
  indexed = true;
  if (chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar9 = (pointer)0x0;
  }
  else {
    lVar16 = 0;
    lVar14 = 0;
    pcVar15 = (pointer)0x0;
    do {
      rfilename._M_pathname._M_dataplus._M_p = (pointer)&rfilename._M_pathname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rfilename,replacementTemplate._M_dataplus._M_p,
                 replacementTemplate._M_dataplus._M_p + replacementTemplate._M_string_length);
      std::__cxx11::string::append((char *)&rfilename);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&rfilename,
                                  *(ulong *)((long)&((header.chunks.
                                                                                                            
                                                  super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->name).
                                                  _M_dataplus._M_p + lVar16));
      replacementName._M_dataplus._M_p = (pointer)&replacementName.field_2;
      psVar13 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar13) {
        replacementName.field_2._M_allocated_capacity = *psVar13;
        replacementName.field_2._8_8_ = plVar8[3];
      }
      else {
        replacementName.field_2._M_allocated_capacity = *psVar13;
        replacementName._M_dataplus._M_p = (pointer)*plVar8;
      }
      replacementName._M_string_length = plVar8[1];
      *plVar8 = (long)psVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rfilename._M_pathname._M_dataplus._M_p != &rfilename._M_pathname.field_2) {
        operator_delete(rfilename._M_pathname._M_dataplus._M_p,
                        rfilename._M_pathname.field_2._M_allocated_capacity + 1);
      }
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,replacementName._M_dataplus._M_p,
                 replacementName._M_dataplus._M_p + replacementName._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_a0,&__str_1,auto_format);
      std::filesystem::__cxx11::operator/(&rfilename,&replacementDir,&local_a0);
      std::filesystem::__cxx11::path::~path(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      Image::readPNG((Image *)&local_a0,&rfilename);
      puVar1 = (undefined8 *)
               ((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                         super__Vector_impl_data._M_start)->size).width + lVar14);
      *puVar1 = local_a0._M_pathname._M_dataplus._M_p;
      std::vector<Color,_std::allocator<Color>_>::_M_move_assign
                ((vector<Color,_std::allocator<Color>_> *)(puVar1 + 1),
                 &local_a0._M_pathname._M_string_length);
      if ((void *)local_a0._M_pathname._M_string_length != (void *)0x0) {
        operator_delete((void *)local_a0._M_pathname._M_string_length,
                        local_a0._M_pathname.field_2._8_8_ - local_a0._M_pathname._M_string_length);
      }
      bVar5 = Compressor::canPalette
                        (&compressor,
                         (Image *)((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->size).width
                                  + lVar14),false);
      if (!bVar5) {
        fprintf(_stderr,
                "%s has too many colors to palette, disabling indexed color for all images\n",
                replacementName._M_dataplus._M_p);
        indexed = false;
      }
      std::filesystem::__cxx11::path::~path(&rfilename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)replacementName._M_dataplus._M_p != &replacementName.field_2) {
        operator_delete(replacementName._M_dataplus._M_p,
                        replacementName.field_2._M_allocated_capacity + 1);
      }
      pcVar15 = pcVar15 + 1;
      pcVar9 = (pointer)(((long)chunks.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)chunks.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555);
      lVar14 = lVar14 + 0x20;
      lVar16 = lVar16 + 0x38;
    } while (pcVar15 < pcVar9);
  }
  local_a0._M_pathname._M_dataplus._M_p = &indexed;
  header.indexed = (uint32_t)indexed;
  local_a0._M_pathname._M_string_length = (size_type)&chunks;
  local_a0._M_pathname.field_2._M_allocated_capacity = (size_type)&images;
  local_a0._M_pathname.field_2._8_8_ = &header;
  i.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  replacementName.field_2._M_allocated_capacity = 0;
  replacementName._M_dataplus._M_p = (pointer)0x0;
  replacementName._M_string_length = 0;
  __str_1._M_dataplus._M_p = pcVar9;
  iVar6 = std::thread::hardware_concurrency();
  _Var2 = replacementName._M_dataplus;
  sVar3 = replacementName._M_string_length;
  if (iVar6 != 0) {
    uVar20 = 0;
    __args = extraout_RDX;
    do {
      sVar3 = replacementName._M_string_length;
      _Var2._M_p = replacementName._M_dataplus._M_p;
      rfilename._M_pathname._M_dataplus._M_p = &local_189;
      rfilename._M_pathname._M_string_length = (size_type)&i;
      rfilename._M_pathname.field_2._M_allocated_capacity = (size_type)&__str_1;
      rfilename._M_pathname.field_2._8_8_ = &local_a0;
      if (replacementName._M_string_length == replacementName.field_2._M_allocated_capacity) {
        if (replacementName._M_string_length - (long)replacementName._M_dataplus._M_p ==
            0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar17 = (long)(replacementName._M_string_length - (long)replacementName._M_dataplus._M_p)
                 >> 3;
        uVar19 = uVar17 + (uVar17 == 0);
        local_198 = uVar19 + uVar17;
        if (0xffffffffffffffe < local_198) {
          local_198 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar19,uVar17)) {
          local_198 = 0xfffffffffffffff;
        }
        if (local_198 == 0) {
          ptVar10 = (thread *)0x0;
        }
        else {
          ptVar10 = __gnu_cxx::new_allocator<std::thread>::allocate
                              ((new_allocator<std::thread> *)&replacementName,local_198,(void *)0x0)
          ;
          __args = extraout_RDX_00;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>(unsigned_long,unsigned_long,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1&&)::_lambda()_1_>
                  ((allocator_type *)(ptVar10 + uVar17),(thread *)&rfilename,__args);
        ptVar18 = ptVar10;
        for (_Var11._M_p = _Var2._M_p; _Var11._M_p != (pointer)sVar3; _Var11._M_p = _Var11._M_p + 8)
        {
          (ptVar18->_M_id)._M_thread = 0;
          (ptVar18->_M_id)._M_thread = *(native_handle_type *)_Var11._M_p;
          *(native_handle_type *)_Var11._M_p = 0;
          ptVar18 = ptVar18 + 1;
        }
        if (_Var2._M_p != (pointer)0x0) {
          operator_delete(_Var2._M_p,
                          replacementName.field_2._M_allocated_capacity - (long)_Var2._M_p);
        }
        replacementName.field_2._M_allocated_capacity = (size_type)(ptVar10 + local_198);
        replacementName._M_dataplus._M_p = (pointer)ptVar10;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>(unsigned_long,unsigned_long,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1&&)::_lambda()_1_>
                  ((allocator_type *)replacementName._M_string_length,(thread *)&rfilename,__args);
        ptVar18 = (thread *)replacementName._M_string_length;
      }
      replacementName._M_string_length = (size_type)(ptVar18 + 1);
      uVar20 = uVar20 + 1;
      uVar7 = std::thread::hardware_concurrency();
      __args = extraout_RDX_01;
      _Var2 = replacementName._M_dataplus;
      sVar3 = replacementName._M_string_length;
    } while (uVar20 < uVar7);
  }
  for (; sVar4 = replacementName._M_string_length,
      _Var2._M_p != (pointer)replacementName._M_string_length; _Var2._M_p = _Var2._M_p + 8) {
    replacementName._M_string_length = sVar3;
    std::thread::join();
    sVar3 = replacementName._M_string_length;
    replacementName._M_string_length = sVar4;
  }
  replacementName._M_string_length = sVar3;
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&replacementName);
  sVar12 = TxaHeader::updateAndCalcBinSize(&header);
  header.filesize = (uint32_t)sVar12;
  for (__n = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
      __n != header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
             super__Vector_impl_data._M_finish; __n = __n + 1) {
    uVar20 = (int)sVar12 + 0xfU & 0xfffffff0;
    __n->offset = uVar20;
    header.filesize = uVar20 + __n->length;
    sVar12 = (size_t)header.filesize;
  }
  TxaHeader::write(&header,(int)output,in,(size_t)__n);
  if (chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 8;
    uVar19 = 0;
    lVar16 = 8;
    do {
      std::ostream::seekp((long)output,
                          *(_Ios_Seekdir *)
                           ((long)&(header.chunks.
                                    super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                                    super__Vector_impl_data._M_start)->index + lVar14));
      std::ostream::write((char *)output,
                          *(long *)((long)chunks.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8));
      uVar19 = uVar19 + 1;
      lVar16 = lVar16 + 0x18;
      lVar14 = lVar14 + 0x38;
    } while (uVar19 < (ulong)(((long)chunks.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)chunks.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  Compressor::~Compressor(&compressor);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&chunks);
  std::vector<Image,_std::allocator<Image>_>::~vector(&images);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::~vector(&header.chunks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)replacementTemplate._M_dataplus._M_p != &replacementTemplate.field_2) {
    operator_delete(replacementTemplate._M_dataplus._M_p,
                    replacementTemplate.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&replacementDir);
  return 0;
}

Assistant:

int replaceTxa(std::istream &in, std::ostream &output, const fs::path &replacement) {
	fs::path replacementDir = replacement.parent_path();
	std::string replacementTemplate = replacement.stem().string();

	TxaHeader header;
	in >> header;

	std::vector<Image> images(header.chunks.size(), Image());
	std::vector<std::vector<uint8_t>> chunks(header.chunks.size(), std::vector<uint8_t>());
	Compressor compressor;

	bool indexed = true;

	for (size_t i = 0; i < chunks.size(); i++) {
		std::string replacementName = replacementTemplate + "_" + header.chunks[i].name;
		auto rfilename = replacementDir/fs::u8path(replacementName + ".png");

		try {
			images[i] = Image::readPNG(rfilename);
		} catch (std::runtime_error&) {
			fprintf(stderr, "Failed to load replacement %s, not replacing\n", rfilename.string().c_str());
			const auto& chunk = header.chunks[i];
			processChunkNoHeader(images[i], chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, replacementName, header.isSwitch);
		}

		if (!compressor.canPalette(images[i], false)) {
			fprintf(stderr, "%s has too many colors to palette, disabling indexed color for all images\n", replacementName.c_str());
			indexed = false;
		}
	}

	header.indexed = indexed;

	parallel_for(0, chunks.size(), []{ return Compressor(); }, [&](Compressor& c, size_t i) {
		ChunkHeader::Type type = indexed ? ChunkHeader::TYPE_INDEXED : ChunkHeader::TYPE_COLOR;
		if (!c.encodeHeaderlessChunk(chunks[i], images[i], type, header.isSwitch)) {
			throw std::runtime_error("Failed to encode chunk " + std::to_string(i));
		}
		auto& h = header.chunks[i];
		h.decodedLength = indexed ? (1024 + images[i].size.area()) : (4 * images[i].size.area());
		h.width = images[i].size.width;
		h.height = images[i].size.height;
		h.length = chunks[i].size();
	});

	int pos = header.updateAndCalcBinSize();
	for (auto& chunk : header.chunks) {
		pos = align(pos, 16);
		chunk.offset = pos;
		pos += chunk.length;
	}

	header.filesize = pos;
	header.write(output, in);
	for (size_t i = 0; i < chunks.size(); i++) {
		output.seekp(header.chunks[i].offset, output.beg);
		output.write(reinterpret_cast<const char*>(chunks[i].data()), chunks[i].size());
	}
	return 0;
}